

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupAppendShare(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTwo_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ManCiNum(pNew);
  iVar2 = Gia_ManCiNum(pTwo);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x3f1,"void Gia_ManDupAppendShare(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Vec_IntSize(&pNew->vHTable);
  if (iVar1 == 0) {
    Gia_ManHashStart(pNew);
  }
  pGVar4 = Gia_ManConst0(pTwo);
  pGVar4->Value = 0;
  local_24 = 1;
  while( true ) {
    bVar5 = false;
    if (local_24 < pTwo->nObjs) {
      pGStack_20 = Gia_ManObj(pTwo,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_20);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy(pGStack_20);
          uVar3 = Gia_ManAppendCo(pNew,iVar1);
          pGStack_20->Value = uVar3;
        }
      }
      else {
        iVar1 = Gia_ObjCioId(pGStack_20);
        pGVar4 = Gia_ManCi(pNew,iVar1);
        uVar3 = Gia_Obj2Lit(pNew,pGVar4);
        pGStack_20->Value = uVar3;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      iVar2 = Gia_ObjFanin1Copy(pGStack_20);
      uVar3 = Gia_ManHashAnd(pNew,iVar1,iVar2);
      pGStack_20->Value = uVar3;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Gia_ManDupAppendShare( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo) );
    if ( Vec_IntSize(&pNew->vHTable) == 0 )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_Obj2Lit( pNew, Gia_ManCi( pNew, Gia_ObjCioId(pObj) ) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}